

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_context_is_device_id_equal__alsa
                    (ma_context *pContext,ma_device_id *pID0,ma_device_id *pID1)

{
  int iVar1;
  ma_device_id *pID1_local;
  ma_device_id *pID0_local;
  ma_context *pContext_local;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x413e,
                  "ma_bool32 ma_context_is_device_id_equal__alsa(ma_context *, const ma_device_id *, const ma_device_id *)"
                 );
  }
  if (pID0 != (ma_device_id *)0x0) {
    if (pID1 != (ma_device_id *)0x0) {
      iVar1 = ma_strcmp(pID0->alsa,pID1->alsa);
      return (ma_bool32)(iVar1 == 0);
    }
    __assert_fail("pID1 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4140,
                  "ma_bool32 ma_context_is_device_id_equal__alsa(ma_context *, const ma_device_id *, const ma_device_id *)"
                 );
  }
  __assert_fail("pID0 != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x413f,
                "ma_bool32 ma_context_is_device_id_equal__alsa(ma_context *, const ma_device_id *, const ma_device_id *)"
               );
}

Assistant:

static ma_bool32 ma_context_is_device_id_equal__alsa(ma_context* pContext, const ma_device_id* pID0, const ma_device_id* pID1)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pID0 != NULL);
    MA_ASSERT(pID1 != NULL);
    (void)pContext;

    return ma_strcmp(pID0->alsa, pID1->alsa) == 0;
}